

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O0

int Eigen::internal::clear_mark<int>(int n_row,Colamd_Row<int> *Row)

{
  int local_1c;
  int r;
  Colamd_Row<int> *Row_local;
  int n_row_local;
  
  for (local_1c = 0; local_1c < n_row; local_1c = local_1c + 1) {
    if (-1 < Row[local_1c].shared2.mark) {
      Row[local_1c].shared2.mark = 0;
    }
  }
  return 1;
}

Assistant:

static inline  Index clear_mark  /* return the new value for tag_mark */
  (
      /* === Parameters ======================================================= */

    Index n_row,    /* number of rows in A */
    Colamd_Row<Index> Row [] /* Row [0 ... n_row-1].shared2.mark is set to zero */
    )
{
  /* === Local variables ================================================== */

  Index r ;

  for (r = 0 ; r < n_row ; r++)
  {
    if (ROW_IS_ALIVE (r))
    {
      Row [r].shared2.mark = 0 ;
    }
  }
  return (1) ;
}